

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

pair<bool,_Point> intersection(Segment *segment,Sphere *sphere)

{
  bool bVar1;
  float fVar2;
  double dVar3;
  Point local_9c;
  bool local_8d;
  Point local_8c;
  bool local_7d;
  float local_7c;
  float local_78;
  float t;
  float local_70;
  bool local_69;
  float local_68;
  float local_64;
  float discriminant;
  float c;
  float b;
  float a;
  float cz;
  float cy;
  float cx;
  float dz;
  float dy;
  float dx;
  float z1;
  float y1;
  float x1;
  float z0;
  float y0;
  float x0;
  Sphere *sphere_local;
  Segment *segment_local;
  
  z0 = (segment->a).x;
  x1 = (segment->a).y;
  y1 = (segment->a).z;
  z1 = (segment->b).x;
  dx = (segment->b).y;
  dy = (segment->b).z;
  dz = z1 - z0;
  cx = dx - x1;
  cy = dy - y1;
  cz = (sphere->center).x;
  a = (sphere->center).y;
  b = (sphere->center).z;
  c = cy * cy + dz * dz + cx * cx;
  discriminant = cy * 2.0 * (y1 - b) + dz * 2.0 * (z0 - cz) + cx * 2.0 * (x1 - a);
  fVar2 = b * y1 + cz * z0 + a * x1;
  local_64 = -sphere->radius * sphere->radius +
             ((y1 * y1 + x1 * x1 + z0 * z0 + b * b + cz * cz + a * a) - (fVar2 + fVar2));
  local_68 = discriminant * discriminant + -(c * 4.0 * local_64);
  _y0 = sphere;
  sphere_local = (Sphere *)segment;
  bVar1 = isCloseToZero<float>(local_68);
  if ((bVar1) || (0.0 <= local_68)) {
    fVar2 = -discriminant;
    dVar3 = std::sqrt((double)(ulong)(uint)local_68);
    local_7c = (fVar2 - SUB84(dVar3,0)) / (c * 2.0);
    if (0.0 <= local_7c) {
      local_8d = true;
      local_9c.x = local_7c * dz + z0;
      local_9c.y = local_7c * cx + x1;
      local_9c.z = local_7c * cy + y1;
      std::pair<bool,_Point>::pair<bool,_true>
                ((pair<bool,_Point> *)&segment_local,&local_8d,&local_9c);
    }
    else {
      local_7d = false;
      local_8c.x = 0.0;
      local_8c.y = 0.0;
      local_8c.z = 0.0;
      std::pair<bool,_Point>::pair<bool,_true>
                ((pair<bool,_Point> *)&segment_local,&local_7d,&local_8c);
    }
  }
  else {
    local_69 = false;
    local_78 = 0.0;
    t = 0.0;
    local_70 = 0.0;
    std::pair<bool,_Point>::pair<bool,_true>
              ((pair<bool,_Point> *)&segment_local,&local_69,(Point *)&stack0xffffffffffffff88);
  }
  return _segment_local;
}

Assistant:

std::pair<bool, Point> intersection(Segment const& segment, Sphere const& sphere)
{
  float x0 = segment.a.x;
  float y0 = segment.a.y;
  float z0 = segment.a.z;

  float x1 = segment.b.x;
  float y1 = segment.b.y;
  float z1 = segment.b.z;

  float dx = x1 - x0;
  float dy = y1 - y0;
  float dz = z1 - z0;

  float cx = sphere.center.x;
  float cy = sphere.center.y;
  float cz = sphere.center.z;

  float a = dx * dx + dy * dy + dz * dz;
  float b = 2 * dx * (x0 - cx) + 2 * dy * (y0 - cy) + 2 * dz * (z0 - cz);
  float c = cx * cx + cy * cy + cz * cz + x0 * x0 + y0 * y0 + z0 * z0
            - 2 * (cx * x0 + cy * y0 + cz * z0) - sphere.radius * sphere.radius;

  float discriminant = b * b - 4 * a * c;
  if (!isCloseToZero(discriminant) && discriminant < 0)
    return {false, {}};

  float t = (-b - std::sqrt(discriminant)) / (2 * a);
  if (t < 0)
    return {false, {}};

  return {true, {x0 + t * dx, y0 + t * dy, z0 + t * dz}};
}